

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_LoudnessMeter.cpp
# Opt level: O0

int LoudnessMeter::CreateCallback(UnityAudioEffectState *state)

{
  EffectData *this;
  float updateRateInHz;
  EffectData *data;
  UnityAudioEffectState *state_local;
  
  this = (EffectData *)operator_new(0x160);
  EffectData::EffectData(this);
  memset(this,0,0x160);
  InitParametersFromDefinitions(InternalRegisterEffectDefinition,(float *)this);
  (state->field_0).field_0.effectdata = this;
  updateRateInHz = (float)(state->field_0).field_0.samplerate;
  LoudnessAnalyzer::Init(&this->momentary,3.0,updateRateInHz,0.4,0.4,updateRateInHz);
  LoudnessAnalyzer::Init
            (&this->shortterm,1800.0,4.0,3.0,3.0,(float)(state->field_0).field_0.samplerate);
  LoudnessAnalyzer::Init
            (&this->integrated,1800.0,1.0,3.0,3.0,(float)(state->field_0).field_0.samplerate);
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK CreateCallback(UnityAudioEffectState* state)
    {
        EffectData* data = new EffectData;
        memset(data, 0, sizeof(EffectData));
        InitParametersFromDefinitions(InternalRegisterEffectDefinition, data->p);
        state->effectdata = data;
        data->momentary.Init(3.0f, (float)state->samplerate, 0.4f, 0.4f, (float)state->samplerate);
        data->shortterm.Init(kMaxWindowLength, 4.0f, 3.0f, 3.0f, (float)state->samplerate);
        data->integrated.Init(kMaxWindowLength, 1.0f, 3.0f, 3.0f, (float)state->samplerate);
        return UNITY_AUDIODSP_OK;
    }